

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O3

int deqp::gles31::Functional::anon_unknown_0::getIOSubVariableLocation
              (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               *path,int startNdx,int currentLocation)

{
  Type TVar1;
  StructType *pSVar2;
  int iVar3;
  pointer pVVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  while( true ) {
    if (currentLocation == -1) {
      return -1;
    }
    pVVar4 = (path->
             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar5 = startNdx;
    while( true ) {
      TVar1 = (pVVar4[iVar5].m_data.type)->m_type;
      if (TVar1 != TYPE_ARRAY) break;
      iVar5 = iVar5 + 1;
    }
    if (TVar1 == TYPE_BASIC) {
      return currentLocation;
    }
    if (TVar1 != TYPE_STRUCT) {
      return -1;
    }
    pSVar2 = ((pVVar4[iVar5].m_data.type)->m_data).structPtr;
    lVar6 = *(long *)&(pSVar2->m_members).
                      super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                      _M_impl;
    if ((int)((ulong)((long)*(pointer *)
                             ((long)&(pSVar2->m_members).
                                     super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                             + 8) - lVar6) >> 3) * -0x49249249 < 1) break;
    startNdx = iVar5 + 1;
    lVar8 = 0x20;
    lVar7 = 0;
    while ((VarType *)(lVar6 + lVar8) != pVVar4[startNdx].m_data.type) {
      iVar3 = -1;
      if (currentLocation != -1) {
        iVar3 = getVariableLocationLength((VarType *)(lVar6 + lVar8));
        pVVar4 = (path->
                 super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar3 = iVar3 + currentLocation;
      }
      currentLocation = iVar3;
      lVar7 = lVar7 + 1;
      pSVar2 = ((pVVar4[iVar5].m_data.type)->m_data).structPtr;
      lVar6 = *(long *)&(pSVar2->m_members).
                        super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                        _M_impl;
      lVar8 = lVar8 + 0x38;
      if ((int)((ulong)((long)*(pointer *)
                               ((long)&(pSVar2->m_members).
                                       super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                               + 8) - lVar6) >> 3) * -0x49249249 <= lVar7) {
        return -1;
      }
    }
  }
  return -1;
}

Assistant:

static int getIOSubVariableLocation (const std::vector<VariablePathComponent>& path, int startNdx, int currentLocation)
{
	if (currentLocation == -1)
		return -1;

	if (path[startNdx].getVariableType()->isBasicType())
		return currentLocation;
	else if (path[startNdx].getVariableType()->isArrayType())
		return getIOSubVariableLocation(path, startNdx+1, currentLocation);
	else if (path[startNdx].getVariableType()->isStructType())
	{
		for (int ndx = 0; ndx < path[startNdx].getVariableType()->getStructPtr()->getNumMembers(); ++ndx)
		{
			if (&path[startNdx].getVariableType()->getStructPtr()->getMember(ndx).getType() == path[startNdx + 1].getVariableType())
				return getIOSubVariableLocation(path, startNdx + 1, currentLocation);

			if (currentLocation != -1)
				currentLocation += getVariableLocationLength(path[startNdx].getVariableType()->getStructPtr()->getMember(ndx).getType());
		}

		// could not find member, never happens
		DE_ASSERT(false);
		return -1;
	}
	else
	{
		DE_ASSERT(false);
		return -1;
	}
}